

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O0

ssize_t __thiscall zmq::pipe_t::write(pipe_t *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  undefined7 extraout_var;
  pipe_t *ppVar4;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  pipe_t *this_00;
  bool bVar5;
  bool is_routing_id;
  bool more;
  undefined1 local_1;
  
  this_00 = (pipe_t *)CONCAT44(in_register_00000034,__fd);
  bVar1 = check_write(this_00);
  ppVar4 = (pipe_t *)(CONCAT71(extraout_var,bVar1) ^ 0xff);
  if (((ulong)ppVar4 & 1) == 0) {
    bVar2 = msg_t::flags((msg_t *)this_00);
    bVar5 = (bVar2 & 1) != 0;
    bVar1 = msg_t::is_routing_id((msg_t *)this_00);
    iVar3 = (*this->_out_pipe->_vptr_ypipe_base_t[2])(this->_out_pipe,this_00,bVar5);
    ppVar4 = (pipe_t *)CONCAT44(extraout_var_00,iVar3);
    if ((!bVar5) && (!bVar1)) {
      this->_msgs_written = this->_msgs_written + 1;
      ppVar4 = this;
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  return CONCAT71((int7)((ulong)ppVar4 >> 8),local_1);
}

Assistant:

bool zmq::pipe_t::write (const msg_t *msg_)
{
    if (unlikely (!check_write ()))
        return false;

    const bool more = (msg_->flags () & msg_t::more) != 0;
    const bool is_routing_id = msg_->is_routing_id ();
    _out_pipe->write (*msg_, more);
    if (!more && !is_routing_id)
        _msgs_written++;

    return true;
}